

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplaceRealloc<slang::SourceLocation>
          (SmallVectorBase<slang::SourceLocation> *this,pointer pos,SourceLocation *args)

{
  ulong uVar1;
  size_type sVar2;
  pointer pSVar3;
  SourceLocation *pSVar4;
  SourceLocation *pSVar5;
  SourceLocation *__cur;
  SourceLocation *pSVar6;
  EVP_PKEY_CTX *ctx;
  long lVar7;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  ctx = (EVP_PKEY_CTX *)0x8;
  pSVar4 = (SourceLocation *)detail::allocArray(capacity,8);
  *(SourceLocation *)((long)pSVar4 + lVar7) = *args;
  pSVar5 = this->data_;
  pSVar6 = pSVar4;
  if (pSVar5 + this->len == pos) {
    for (; pSVar5 != pos; pSVar5 = pSVar5 + 1) {
      *pSVar6 = *pSVar5;
      pSVar6 = pSVar6 + 1;
    }
  }
  else {
    for (; pSVar5 != pos; pSVar5 = pSVar5 + 1) {
      *pSVar6 = *pSVar5;
      pSVar6 = pSVar6 + 1;
    }
    sVar2 = this->len;
    pSVar3 = this->data_;
    pSVar5 = (SourceLocation *)((long)pSVar4 + lVar7);
    for (; pSVar5 = pSVar5 + 1, pos != pSVar3 + sVar2; pos = pos + 1) {
      *pSVar5 = *pos;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar4;
  return (pointer)((long)pSVar4 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}